

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transitions.hpp
# Opt level: O0

transition_table_type<afsm::test::events::commit> *
afsm::transitions::
state_transition_table<afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>,afsm::test::connection_fsm_def,std::atomic<unsigned_long>>
::transition_table<afsm::test::events::commit,0ul,1ul,2ul,3ul,4ul,5ul>
          (indexes_tuple<0UL,_1UL,_2UL,_3UL,_4UL,_5UL> *param_1)

{
  int iVar1;
  no_transition<afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::transitions::state_transition_table<afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::connection_fsm_def,_std::atomic<unsigned_long>_>_>
  local_16;
  no_transition<afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::transitions::state_transition_table<afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::connection_fsm_def,_std::atomic<unsigned_long>_>_>
  local_15;
  no_transition<afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::transitions::state_transition_table<afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::connection_fsm_def,_std::atomic<unsigned_long>_>_>
  local_14;
  no_transition<afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::transitions::state_transition_table<afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::connection_fsm_def,_std::atomic<unsigned_long>_>_>
  local_13;
  no_transition<afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::transitions::state_transition_table<afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::connection_fsm_def,_std::atomic<unsigned_long>_>_>
  local_12;
  no_transition<afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::transitions::state_transition_table<afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::connection_fsm_def,_std::atomic<unsigned_long>_>_>
  local_11;
  indexes_tuple<0UL,_1UL,_2UL,_3UL,_4UL,_5UL> *local_10;
  indexes_tuple<0UL,_1UL,_2UL,_3UL,_4UL,_5UL> *param_1_local;
  
  if (transition_table<afsm::test::events::commit,0ul,1ul,2ul,3ul,4ul,5ul>(psst::meta::indexes_tuple<0ul,1ul,2ul,3ul,4ul,5ul>const&)
      ::_table == '\0') {
    local_10 = param_1;
    iVar1 = __cxa_guard_acquire(&transition_table<afsm::test::events::commit,0ul,1ul,2ul,3ul,4ul,5ul>(psst::meta::indexes_tuple<0ul,1ul,2ul,3ul,4ul,5ul>const&)
                                 ::_table);
    if (iVar1 != 0) {
      std::
      function<afsm::actions::event_process_result(afsm::transitions::state_transition_table<afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>,afsm::test::connection_fsm_def,std::atomic<unsigned_long>>&,afsm::test::events::commit&&)>
      ::
      function<afsm::transitions::detail::no_transition<afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>,afsm::transitions::state_transition_table<afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>,afsm::test::connection_fsm_def,std::atomic<unsigned_long>>>,void>
                ((function<afsm::actions::event_process_result(afsm::transitions::state_transition_table<afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>,afsm::test::connection_fsm_def,std::atomic<unsigned_long>>&,afsm::test::events::commit&&)>
                  *)&state_transition_table<afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::connection_fsm_def,_std::atomic<unsigned_long>_>
                     ::transition_table<afsm::test::events::commit,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL>::
                     _table,&local_11);
      std::
      function<afsm::actions::event_process_result(afsm::transitions::state_transition_table<afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>,afsm::test::connection_fsm_def,std::atomic<unsigned_long>>&,afsm::test::events::commit&&)>
      ::
      function<afsm::transitions::detail::no_transition<afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>,afsm::transitions::state_transition_table<afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>,afsm::test::connection_fsm_def,std::atomic<unsigned_long>>>,void>
                ((function<afsm::actions::event_process_result(afsm::transitions::state_transition_table<afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>,afsm::test::connection_fsm_def,std::atomic<unsigned_long>>&,afsm::test::events::commit&&)>
                  *)(state_transition_table<afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::connection_fsm_def,_std::atomic<unsigned_long>_>
                     ::transition_table<afsm::test::events::commit,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL>::
                     _table._M_elems + 1),&local_12);
      std::
      function<afsm::actions::event_process_result(afsm::transitions::state_transition_table<afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>,afsm::test::connection_fsm_def,std::atomic<unsigned_long>>&,afsm::test::events::commit&&)>
      ::
      function<afsm::transitions::detail::no_transition<afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>,afsm::transitions::state_transition_table<afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>,afsm::test::connection_fsm_def,std::atomic<unsigned_long>>>,void>
                ((function<afsm::actions::event_process_result(afsm::transitions::state_transition_table<afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>,afsm::test::connection_fsm_def,std::atomic<unsigned_long>>&,afsm::test::events::commit&&)>
                  *)(state_transition_table<afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::connection_fsm_def,_std::atomic<unsigned_long>_>
                     ::transition_table<afsm::test::events::commit,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL>::
                     _table._M_elems + 2),&local_13);
      std::
      function<afsm::actions::event_process_result(afsm::transitions::state_transition_table<afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>,afsm::test::connection_fsm_def,std::atomic<unsigned_long>>&,afsm::test::events::commit&&)>
      ::
      function<afsm::transitions::detail::no_transition<afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>,afsm::transitions::state_transition_table<afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>,afsm::test::connection_fsm_def,std::atomic<unsigned_long>>>,void>
                ((function<afsm::actions::event_process_result(afsm::transitions::state_transition_table<afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>,afsm::test::connection_fsm_def,std::atomic<unsigned_long>>&,afsm::test::events::commit&&)>
                  *)(state_transition_table<afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::connection_fsm_def,_std::atomic<unsigned_long>_>
                     ::transition_table<afsm::test::events::commit,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL>::
                     _table._M_elems + 3),&local_14);
      std::
      function<afsm::actions::event_process_result(afsm::transitions::state_transition_table<afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>,afsm::test::connection_fsm_def,std::atomic<unsigned_long>>&,afsm::test::events::commit&&)>
      ::
      function<afsm::transitions::detail::no_transition<afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>,afsm::transitions::state_transition_table<afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>,afsm::test::connection_fsm_def,std::atomic<unsigned_long>>>,void>
                ((function<afsm::actions::event_process_result(afsm::transitions::state_transition_table<afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>,afsm::test::connection_fsm_def,std::atomic<unsigned_long>>&,afsm::test::events::commit&&)>
                  *)(state_transition_table<afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::connection_fsm_def,_std::atomic<unsigned_long>_>
                     ::transition_table<afsm::test::events::commit,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL>::
                     _table._M_elems + 4),&local_15);
      std::
      function<afsm::actions::event_process_result(afsm::transitions::state_transition_table<afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>,afsm::test::connection_fsm_def,std::atomic<unsigned_long>>&,afsm::test::events::commit&&)>
      ::
      function<afsm::transitions::detail::no_transition<afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>,afsm::transitions::state_transition_table<afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>,afsm::test::connection_fsm_def,std::atomic<unsigned_long>>>,void>
                ((function<afsm::actions::event_process_result(afsm::transitions::state_transition_table<afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>,afsm::test::connection_fsm_def,std::atomic<unsigned_long>>&,afsm::test::events::commit&&)>
                  *)(state_transition_table<afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::connection_fsm_def,_std::atomic<unsigned_long>_>
                     ::transition_table<afsm::test::events::commit,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL>::
                     _table._M_elems + 5),&local_16);
      __cxa_atexit(std::
                   array<std::function<afsm::actions::event_process_result_(afsm::transitions::state_transition_table<afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::connection_fsm_def,_std::atomic<unsigned_long>_>_&,_afsm::test::events::commit_&&)>,_6UL>
                   ::~array,&state_transition_table<afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::connection_fsm_def,_std::atomic<unsigned_long>_>
                             ::
                             transition_table<afsm::test::events::commit,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL>
                             ::_table,&__dso_handle);
      __cxa_guard_release(&transition_table<afsm::test::events::commit,0ul,1ul,2ul,3ul,4ul,5ul>(psst::meta::indexes_tuple<0ul,1ul,2ul,3ul,4ul,5ul>const&)
                           ::_table);
    }
  }
  return &state_transition_table<afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::connection_fsm_def,_std::atomic<unsigned_long>_>
          ::transition_table<afsm::test::events::commit,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL>::_table;
}

Assistant:

static transition_table_type< Event > const&
    transition_table( ::psst::meta::indexes_tuple< Indexes... > const& )
    {
        using event_type = typename ::std::decay<Event>::type;
        using event_transitions = typename ::psst::meta::find_if<
                def::handles_event< event_type >::template type, transitions_tuple >::type;
        static transition_table_type< Event > _table {{
            typename detail::transition_action_selector< fsm_type, this_type,
                typename ::psst::meta::find_if<
                    def::originates_from<
                        typename inner_states_def::template type< Indexes >
                    >::template type,
                    event_transitions
                >::type >::type{} ...
        }};
        return _table;
    }